

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PPCDisassembler.c
# Opt level: O3

DecodeStatus decodeMemRIOperands(MCInst *Inst,uint64_t Imm,int64_t Address,void *Decoder)

{
  uint uVar1;
  MCOperand *Op;
  ulong uVar2;
  
  if (0x1fffff < Imm) {
    return MCDisassembler_Fail;
  }
  uVar2 = Imm >> 0x10;
  uVar1 = MCInst_getOpcode(Inst);
  if ((0x30 < uVar1 - 0x262) || ((0x1000000100841U >> ((ulong)(uVar1 - 0x262) & 0x3f) & 1) == 0)) {
    if ((uVar1 - 0x347 < 0x2a) && ((0x20001042001U >> ((ulong)(uVar1 - 0x347) & 0x3f) & 1) != 0)) {
      Op = MCOperand_CreateReg1(Inst,GP0Regs[uVar2]);
      MCInst_insert0(Inst,0,Op);
      goto LAB_0018b0af;
    }
    if (uVar1 != 0x24e) goto LAB_0018b0af;
  }
  MCOperand_CreateReg0(Inst,GP0Regs[uVar2]);
LAB_0018b0af:
  MCOperand_CreateImm0(Inst,(long)(short)Imm);
  MCOperand_CreateReg0(Inst,GP0Regs[uVar2]);
  return MCDisassembler_Success;
}

Assistant:

static DecodeStatus decodeMemRIOperands(MCInst *Inst, uint64_t Imm,
		int64_t Address, const void *Decoder)
{
	// Decode the memri field (imm, reg), which has the low 16-bits as the
	// displacement and the next 5 bits as the register #.

	uint64_t Base = Imm >> 16;
	uint64_t Disp = Imm & 0xFFFF;

	// assert(Base < 32 && "Invalid base register");
	if (Base >= 32)
		return MCDisassembler_Fail;

	switch (MCInst_getOpcode(Inst)) {
		default: break;
		case PPC_LBZU:
		case PPC_LHAU:
		case PPC_LHZU:
		case PPC_LWZU:
		case PPC_LFSU:
		case PPC_LFDU:
				 // Add the tied output operand.
				 MCOperand_CreateReg0(Inst, GP0Regs[Base]);
				 break;
		case PPC_STBU:
		case PPC_STHU:
		case PPC_STWU:
		case PPC_STFSU:
		case PPC_STFDU:
				 MCInst_insert0(Inst, 0, MCOperand_CreateReg1(Inst, GP0Regs[Base]));
				 break;
	}

	MCOperand_CreateImm0(Inst, SignExtend64(Disp, 16));
	MCOperand_CreateReg0(Inst, GP0Regs[Base]);
	return MCDisassembler_Success;
}